

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRShared.cpp
# Opt level: O2

void __thiscall Assimp::IrrlichtBase::ReadHexProperty(IrrlichtBase *this,HexProperty *out)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  int i;
  uint uVar3;
  allocator local_51;
  string local_50 [32];
  
  uVar3 = 0;
  while( true ) {
    iVar1 = (*this->reader->_vptr_IIrrXMLReader[4])();
    if (iVar1 <= (int)uVar3) break;
    iVar1 = (*this->reader->_vptr_IIrrXMLReader[5])(this->reader,(ulong)uVar3);
    iVar1 = ASSIMP_stricmp((char *)CONCAT44(extraout_var,iVar1),"name");
    if (iVar1 == 0) {
      iVar1 = (*this->reader->_vptr_IIrrXMLReader[6])(this->reader,(ulong)uVar3);
      std::__cxx11::string::string(local_50,(char *)CONCAT44(extraout_var_02,iVar1),&local_51);
      std::__cxx11::string::operator=((string *)out,local_50);
      std::__cxx11::string::~string(local_50);
    }
    else {
      iVar1 = (*this->reader->_vptr_IIrrXMLReader[5])(this->reader,(ulong)uVar3);
      iVar1 = ASSIMP_stricmp((char *)CONCAT44(extraout_var_00,iVar1),"value");
      if (iVar1 == 0) {
        iVar1 = (*this->reader->_vptr_IIrrXMLReader[6])();
        uVar2 = strtoul16((char *)CONCAT44(extraout_var_01,iVar1),(char **)0x0);
        out->value = uVar2;
      }
    }
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void IrrlichtBase::ReadHexProperty    (HexProperty&    out)
{
    for (int i = 0; i < reader->getAttributeCount();++i)
    {
        if (!ASSIMP_stricmp(reader->getAttributeName(i),"name"))
        {
            out.name = std::string( reader->getAttributeValue(i) );
        }
        else if (!ASSIMP_stricmp(reader->getAttributeName(i),"value"))
        {
            // parse the hexadecimal value
            out.value = strtoul16(reader->getAttributeValue(i));
        }
    }
}